

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.cpp
# Opt level: O1

observer_ptr __thiscall
libtorrent::dht::bootstrap::new_observer(bootstrap *this,endpoint *ep,node_id *id)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<libtorrent::dht::get_peers_observer> sVar3;
  observer_ptr oVar4;
  shared_ptr<libtorrent::dht::get_peers_observer> o;
  undefined1 local_48 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  lVar1 = *(long *)((long)&(ep->impl_).data_ + 0x18);
  ::std::__shared_ptr<libtorrent::dht::traversal_algorithm,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::dht::traversal_algorithm,void>
            ((__shared_ptr<libtorrent::dht::traversal_algorithm,(__gnu_cxx::_Lock_policy)2> *)
             (local_48 + 0x10),
             (__weak_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2> *)
             &(ep->impl_).data_.v6.sin6_addr);
  sVar3 = rpc_manager::
          allocate_observer<libtorrent::dht::get_peers_observer,std::shared_ptr<libtorrent::dht::traversal_algorithm>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::digest32<160l>const&>
                    ((rpc_manager *)local_48,
                     (shared_ptr<libtorrent::dht::traversal_algorithm> *)(lVar1 + 0x170),
                     (basic_endpoint<boost::asio::ip::udp> *)(local_48 + 0x10),id);
  _Var2 = sVar3.super___shared_ptr<libtorrent::dht::get_peers_observer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    _Var2._M_pi = extraout_RDX;
  }
  (this->super_get_peers).super_find_data.super_traversal_algorithm._vptr_traversal_algorithm =
       (_func_int **)local_48._0_8_;
  (this->super_get_peers).super_find_data.super_traversal_algorithm.
  super_enable_shared_from_this<libtorrent::dht::traversal_algorithm>._M_weak_this.
  super___weak_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_get_peers).super_find_data.super_traversal_algorithm.
  super_enable_shared_from_this<libtorrent::dht::traversal_algorithm>._M_weak_this.
  super___weak_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_48._8_8_;
  oVar4.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  oVar4.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (observer_ptr)
         oVar4.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

observer_ptr bootstrap::new_observer(udp::endpoint const& ep
	, node_id const& id)
{
	auto o = m_node.m_rpc.allocate_observer<get_peers_observer>(self(), ep, id);
#if TORRENT_USE_ASSERTS
	if (o) o->m_in_constructor = false;
#endif
	return o;
}